

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetTxInIssuanceInfoByHandle
              (void *handle,void *tx_data_handle,uint32_t index,char **entropy,char **nonce,
              int64_t *asset_amount,char **asset_value,int64_t *token_amount,char **token_value,
              char **asset_rangeproof,char **token_rangeproof)

{
  bool bVar1;
  char *pcVar2;
  int64_t iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  CfdException *pCVar7;
  Amount AVar8;
  bool is_bitcoin;
  undefined1 local_260 [32];
  char *work_asset_rangeproof;
  char *work_token_value;
  char *work_asset_value;
  char *work_nonce;
  char *work_entropy;
  void *local_218;
  undefined8 local_210;
  ConfidentialValue local_208;
  char *local_1e0;
  char *local_1d8;
  ConfidentialValue local_1d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  ConfidentialTxInReference ref;
  
  work_entropy = (char *)0x0;
  work_nonce = (char *)0x0;
  work_asset_value = (char *)0x0;
  work_token_value = (char *)0x0;
  work_asset_rangeproof = (char *)0x0;
  local_210 = 0;
  local_218 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ref,"TransactionData",(allocator *)&local_208);
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  if (*(ConfidentialTransaction **)((long)tx_data_handle + 0x18) == (ConfidentialTransaction *)0x0)
  {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ref,"Invalid handle state. tx is null",(allocator *)&local_208);
    cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalStateError,(string *)&ref);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin != true) {
    cfd::core::ConfidentialTransaction::GetTxIn
              (&ref,*(ConfidentialTransaction **)((long)tx_data_handle + 0x18),index);
    if (entropy == (char **)0x0) {
      local_1d8 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_260,
                 &ref.asset_entropy_.data_);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_1d0,(ByteData256 *)local_260);
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_208,(BlindFactor *)&local_1d0);
      work_entropy = cfd::capi::CreateString((string *)&local_208);
      local_1d8 = work_entropy;
      std::__cxx11::string::~string((string *)&local_208);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_1d0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_260);
    }
    if (nonce == (char **)0x0) {
      local_1e0 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_260,
                 &ref.blinding_nonce_.data_);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_1d0,(ByteData256 *)local_260);
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_208,(BlindFactor *)&local_1d0);
      work_nonce = cfd::capi::CreateString((string *)&local_208);
      local_1e0 = work_nonce;
      std::__cxx11::string::~string((string *)&local_208);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_1d0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_260);
    }
    cfd::core::ConfidentialValue::ConfidentialValue(&local_208,&ref.issuance_amount_);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_1d0,&ref.inflation_keys_);
    if (asset_amount != (int64_t *)0x0) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_208);
      if (!bVar1) {
        bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_208);
        if (bVar1) {
          iVar3 = 0;
        }
        else {
          AVar8 = cfd::core::ConfidentialValue::GetAmount(&local_208);
          local_260._0_8_ = AVar8.amount_;
          local_260[8] = AVar8.ignore_check_;
          iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_260);
        }
        *asset_amount = iVar3;
      }
    }
    if (asset_value == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_260,&local_208);
      pcVar2 = cfd::capi::CreateString((string *)local_260);
      work_asset_value = pcVar2;
      std::__cxx11::string::~string((string *)local_260);
    }
    if (token_amount != (int64_t *)0x0) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_1d0);
      if (!bVar1) {
        bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_1d0);
        if (bVar1) {
          iVar3 = 0;
        }
        else {
          AVar8 = cfd::core::ConfidentialValue::GetAmount(&local_1d0);
          local_260._0_8_ = AVar8.amount_;
          local_260[8] = AVar8.ignore_check_;
          iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_260);
        }
        *token_amount = iVar3;
      }
    }
    if (token_value == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_260,&local_1d0);
      pcVar4 = cfd::capi::CreateString((string *)local_260);
      work_token_value = pcVar4;
      std::__cxx11::string::~string((string *)local_260);
    }
    if (asset_rangeproof == (char **)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,
                 &ref.issuance_amount_rangeproof_.data_);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_260,(ByteData *)&local_1a8);
      pcVar5 = cfd::capi::CreateString((string *)local_260);
      work_asset_rangeproof = pcVar5;
      std::__cxx11::string::~string((string *)local_260);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a8);
    }
    if (token_rangeproof == (char **)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,
                 &ref.inflation_keys_rangeproof_.data_);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_260,(ByteData *)&local_1a8);
      pcVar6 = cfd::capi::CreateString((string *)local_260);
      std::__cxx11::string::~string((string *)local_260);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a8);
    }
    if (local_1d8 != (char *)0x0) {
      *entropy = local_1d8;
    }
    if (local_1e0 != (char *)0x0) {
      *nonce = local_1e0;
    }
    if (pcVar2 != (char *)0x0) {
      *asset_value = pcVar2;
    }
    if (pcVar4 != (char *)0x0) {
      *token_value = pcVar4;
    }
    if (pcVar5 != (char *)0x0) {
      *asset_rangeproof = pcVar5;
    }
    if (pcVar6 != (char *)0x0) {
      *token_rangeproof = pcVar6;
    }
    cfd::core::ConfidentialValue::~ConfidentialValue(&local_1d0);
    cfd::core::ConfidentialValue::~ConfidentialValue(&local_208);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&ref);
    return 0;
  }
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ref,"Invalid handle state. tx is bitcoin.",(allocator *)&local_208);
  cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalStateError,(string *)&ref);
  __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInIssuanceInfoByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** entropy,
    char** nonce, int64_t* asset_amount, char** asset_value,
    int64_t* token_amount, char** token_value, char** asset_rangeproof,
    char** token_rangeproof) {
  char* work_entropy = nullptr;
  char* work_nonce = nullptr;
  char* work_asset_value = nullptr;
  char* work_token_value = nullptr;
  char* work_asset_rangeproof = nullptr;
  char* work_token_rangeproof = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    const ConfidentialTxInReference ref = tx->GetTxIn(index);

    if (entropy != nullptr) {
      work_entropy = CreateString(BlindFactor(ref.GetAssetEntropy()).GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(BlindFactor(ref.GetBlindingNonce()).GetHex());
    }
    const ConfidentialValue& asset_obj = ref.GetIssuanceAmount();
    const ConfidentialValue& token_obj = ref.GetInflationKeys();
    if ((asset_amount != nullptr) && (!asset_obj.HasBlinding())) {
      *asset_amount = (asset_obj.HasBlinding())
                          ? 0
                          : asset_obj.GetAmount().GetSatoshiValue();
    }
    if (asset_value != nullptr) {
      work_asset_value = CreateString(asset_obj.GetHex());
    }
    if ((token_amount != nullptr) && (!token_obj.HasBlinding())) {
      *token_amount = (token_obj.HasBlinding())
                          ? 0
                          : token_obj.GetAmount().GetSatoshiValue();
    }
    if (token_value != nullptr) {
      work_token_value = CreateString(token_obj.GetHex());
    }
    if (asset_rangeproof != nullptr) {
      work_asset_rangeproof =
          CreateString(ref.GetIssuanceAmountRangeproof().GetHex());
    }
    if (token_rangeproof != nullptr) {
      work_token_rangeproof =
          CreateString(ref.GetInflationKeysRangeproof().GetHex());
    }

    if (work_entropy != nullptr) *entropy = work_entropy;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_asset_value != nullptr) *asset_value = work_asset_value;
    if (work_token_value != nullptr) *token_value = work_token_value;
    if (work_asset_rangeproof != nullptr)
      *asset_rangeproof = work_asset_rangeproof;
    if (work_token_rangeproof != nullptr)
      *token_rangeproof = work_token_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}